

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O0

int proxy_client_init(proxy_client_handle *ch)

{
  conn_handle *pcStack_20;
  int ret;
  proxy_client_priv *priv;
  proxy_client_handle *ch_local;
  
  pcStack_20 = (conn_handle *)ch->priv;
  if (pcStack_20 == (conn_handle *)0x0) {
    pcStack_20 = (conn_handle *)calloc(1,0x20);
    if (pcStack_20 == (conn_handle *)0x0) {
      return -0xc;
    }
    ch->priv = pcStack_20;
  }
  pcStack_20->type = CONN_TYPE_TCP;
  ch_local._4_4_ = conn_init(pcStack_20);
  if (ch_local._4_4_ < 0) {
    conn_free(pcStack_20);
    free(ch->priv);
    ch->priv = (void *)0x0;
  }
  else {
    ch_local._4_4_ = 0;
  }
  return ch_local._4_4_;
}

Assistant:

int proxy_client_init(struct proxy_client_handle *ch)
{
	struct proxy_client_priv *priv = ch->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		ch->priv = priv;
	}

	priv->conn.type = CONN_TYPE_TCP;
	ret = conn_init(&priv->conn);
	if (ret < 0)
		goto proxy_client_init_exit;

	return 0;

proxy_client_init_exit:
	conn_free(&priv->conn);

	free(ch->priv);
	ch->priv = NULL;

	return ret;
}